

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
RefundIRCCommand::trigger
          (RefundIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  double dVar1;
  size_t sVar2;
  char *pcVar3;
  PlayerInfo *pPVar4;
  undefined8 uVar5;
  pointer pbVar6;
  RefundIRCCommand *pRVar7;
  byte bVar8;
  bool bVar9;
  size_type sVar10;
  long lVar11;
  reference pvVar12;
  ulong uVar13;
  ulong uVar14;
  const_pointer pvVar15;
  size_type sVar16;
  char *pcVar17;
  char *extraout_RDX;
  __sv_type _Var18;
  basic_string_view<char,_std::char_traits<char>_> bVar19;
  size_t local_1e8;
  char *local_1e0;
  size_t local_1c8;
  char *local_1c0;
  size_t local_1a8;
  char *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  __sv_type local_148;
  string local_138;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  PlayerInfo *local_100;
  Server *server;
  undefined1 local_f0 [4];
  uint i;
  string msg;
  PlayerInfo *player;
  double credits;
  string_view playerName;
  int type;
  Channel *chan;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  split_parameters;
  IRC_Bot *source_local;
  RefundIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (RefundIRCCommand *)nick._M_len;
  nick_local._M_str = (char *)channel._M_len;
  local_60._M_len = parameters._M_len;
  local_60._M_str = parameters._M_str;
  split_parameters.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)source;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&chan," \t");
  jessilib::
  word_split_view<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((container_type *)local_50,&local_60,
             (basic_string_view<char,_std::char_traits<char>_> *)&chan);
  sVar10 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_50);
  sVar2 = nick_local._M_len;
  pRVar7 = this_local;
  pbVar6 = split_parameters.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (sVar10 < 2) {
    bVar19 = sv("Error: Too Few Parameters. Syntax: refund <player> <amount>",0x3b);
    local_1e8 = bVar19._M_len;
    local_1e0 = bVar19._M_str;
    Jupiter::IRC::Client::sendNotice(pbVar6,pRVar7,sVar2,local_1e8,local_1e0);
  }
  else {
    lVar11 = Jupiter::IRC::Client::getChannel
                       (split_parameters.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,nick_local._M_str,
                        channel._M_str);
    if (lVar11 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      pvVar12 = std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)local_50,0);
      sVar2 = pvVar12->_M_len;
      pcVar3 = pvVar12->_M_str;
      pvVar12 = std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)local_50,1);
      bVar19._M_str = extraout_RDX;
      bVar19._M_len = (size_t)pvVar12->_M_str;
      dVar1 = Jupiter::asDouble<char>((Jupiter *)pvVar12->_M_len,bVar19);
      std::__cxx11::string::string((string *)local_f0);
      server._4_4_ = 0;
      while( true ) {
        uVar14 = (ulong)server._4_4_;
        RenX::getCore();
        uVar13 = RenX::Core::getServerCount();
        if (uVar14 == uVar13) break;
        uVar14 = RenX::getCore();
        local_100 = (PlayerInfo *)RenX::Core::getServer(uVar14);
        bVar8 = RenX::Server::isLogChanType((int)local_100);
        if (((bVar8 & 1) != 0) &&
           (sVar10 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                               ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                                &(local_100->name)._M_string_length), sVar10 != 0)) {
          credits._0_4_ = (undefined4)sVar2;
          credits._4_4_ = (undefined4)(sVar2 >> 0x20);
          playerName._M_len._0_4_ = SUB84(pcVar3,0);
          playerName._M_len._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
          local_118 = credits._0_4_;
          uStack_114 = credits._4_4_;
          uStack_110 = (undefined4)playerName._M_len;
          uStack_10c = playerName._M_len._4_4_;
          msg.field_2._8_8_ = RenX::Server::getPlayerByPartName(local_100,sVar2,pcVar3);
          if (msg.field_2._8_8_ != 0) {
            bVar8 = RenX::Server::giveCredits(local_100,dVar1);
            if ((bVar8 & 1) == 0) {
              s_abi_cxx11_(&local_188,"Error: Server does not support refunds.",0x27);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_f0,&local_188);
              std::__cxx11::string::~string((string *)&local_188);
            }
            else {
              sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
              pvVar15 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
              string_printf_abi_cxx11_
                        (&local_138,"You have been refunded %.0f credits by %.*s.",SUB84(dVar1,0),
                         sVar10,pvVar15);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_f0,&local_138);
              std::__cxx11::string::~string((string *)&local_138);
              uVar5 = msg.field_2._8_8_;
              pPVar4 = local_100;
              local_148 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_f0);
              RenX::Server::sendMessage(pPVar4,uVar5,local_148._M_len,local_148._M_str);
              sVar16 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(msg.field_2._8_8_ + 8));
              pcVar17 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(msg.field_2._8_8_ + 8));
              string_printf_abi_cxx11_
                        (&local_168,"%.*s has been refunded %.0f credits.",SUB84(dVar1,0),sVar16,
                         pcVar17);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_f0,&local_168);
              std::__cxx11::string::~string((string *)&local_168);
            }
            pcVar17 = nick_local._M_str;
            pbVar6 = split_parameters.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            _Var18 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_f0);
            local_1a8 = _Var18._M_len;
            local_1a0 = _Var18._M_str;
            Jupiter::IRC::Client::sendMessage(pbVar6,pcVar17,channel._M_str,local_1a8,local_1a0);
          }
        }
        server._4_4_ = server._4_4_ + 1;
      }
      bVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
      sVar2 = nick_local._M_len;
      pRVar7 = this_local;
      pbVar6 = split_parameters.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar9) {
        bVar19 = sv("Error: Player not found.",0x18);
        local_1c8 = bVar19._M_len;
        local_1c0 = bVar19._M_str;
        Jupiter::IRC::Client::sendNotice(pbVar6,pRVar7,sVar2,local_1c8,local_1c0);
      }
      std::__cxx11::string::~string((string *)local_f0);
    }
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_50);
  return;
}

Assistant:

void RefundIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	std::vector<std::string_view> split_parameters = jessilib::word_split_view(std::string_view{parameters}, WHITESPACE_SV);
	if (split_parameters.size() >= 2) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string_view playerName = split_parameters[0];
			double credits = Jupiter::asDouble(split_parameters[1]);
			RenX::PlayerInfo *player;
			std::string msg;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					player = server->getPlayerByPartName(playerName);
					if (player != nullptr) {
						if (server->giveCredits(*player, credits)) {
							msg = string_printf("You have been refunded %.0f credits by %.*s.", credits, nick.size(), nick.data());
							server->sendMessage(*player, msg);
							msg = string_printf("%.*s has been refunded %.0f credits.", player->name.size(), player->name.data(), credits);
						}
						else {
							msg = "Error: Server does not support refunds."s;
						}
						source->sendMessage(channel, msg);
					}
				}
			}
			if (msg.empty()) {
				source->sendNotice(nick, "Error: Player not found."sv);
			}
		}
	}
	else {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: refund <player> <amount>"sv);
	}
}